

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::assertionPassed(RunContext *this)

{
  Counts *pCVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer this_00;
  
  this->m_lastAssertionPassed = true;
  pCVar1 = &(this->m_totals).assertions;
  pCVar1->passed = pCVar1->passed + 1;
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start =
       "{Unknown expression after the reported line}";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0x2c;
  pSVar2 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar2;
  if (pSVar3 != pSVar2) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar3);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  return;
}

Assistant:

void RunContext::assertionPassed() {
        m_lastAssertionPassed = true;
        ++m_totals.assertions.passed;
        resetAssertionInfo();
        m_messageScopes.clear();
    }